

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * ncnn::Mat::from_float16(unsigned_short *data,int size)

{
  int in_EDX;
  void *in_RSI;
  Mat *in_RDI;
  Option opt;
  Mat src;
  Mat *dst;
  Option *in_stack_fffffffffffffe60;
  void **ppvVar1;
  Mat *opt_00;
  undefined4 in_stack_fffffffffffffe98;
  Mat *in_stack_fffffffffffffea0;
  void *local_110;
  int *local_108;
  undefined8 local_100;
  undefined4 local_f8;
  long *local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  long local_d0;
  void **local_98;
  int local_78;
  undefined4 local_74;
  void **local_70;
  undefined8 local_48;
  undefined8 local_40;
  void **local_28;
  
  local_28 = &local_110;
  local_40 = 2;
  local_48 = 0;
  local_108 = (int *)0x0;
  local_100 = 2;
  local_f8 = 1;
  local_f0 = (long *)0x0;
  local_e8 = 1;
  local_e0 = 1;
  local_dc = 1;
  local_d8 = 1;
  local_d0 = (long)in_EDX;
  in_RDI->data = (void *)0x0;
  in_RDI->refcount = (int *)0x0;
  in_RDI->elemsize = 0;
  in_RDI->elempack = 0;
  in_RDI->allocator = (Allocator *)0x0;
  in_RDI->dims = 0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->d = 0;
  in_RDI->c = 0;
  in_RDI->cstep = 0;
  opt_00 = in_RDI;
  local_110 = in_RSI;
  Option::Option(in_stack_fffffffffffffe60);
  cast_float16_to_float32
            (in_stack_fffffffffffffea0,(Mat *)CONCAT44(1,in_stack_fffffffffffffe98),(Option *)opt_00
            );
  ppvVar1 = &local_110;
  if (local_108 != (int *)0x0) {
    local_74 = 0xffffffff;
    LOCK();
    local_78 = *local_108;
    *local_108 = *local_108 + -1;
    UNLOCK();
    if (local_78 == 1) {
      local_98 = ppvVar1;
      local_70 = ppvVar1;
      if (local_f0 == (long *)0x0) {
        if (local_110 != (void *)0x0) {
          free(local_110);
        }
      }
      else {
        (**(code **)(*local_f0 + 0x18))(local_f0,local_110);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return in_RDI;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat src(size, (void*)data, (size_t)2u);
    Mat dst;

    Option opt;
    opt.num_threads = 1; // TODO
    cast_float16_to_float32(src, dst, opt);

    return dst;
}